

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOSystem.cpp
# Opt level: O2

void __thiscall
IOSystemTest_accessDirectoryStackTest_Test::TestBody
          (IOSystemTest_accessDirectoryStackTest_Test *this)

{
  TestIOSystem *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *in_R9;
  char *pcVar3;
  AssertHelper local_78;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  string path;
  
  iVar2 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,(char)iVar2) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if ((char)iVar2 == '\x01') {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&path,(internal *)&gtest_ar_,(AssertionResult *)"pImp->PopDirectory()","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x42,(char *)CONCAT71(path._M_dataplus._M_p._1_7_,(char)path._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&path);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__2._0_8_ = (ulong)(uint)gtest_ar__2._4_4_ << 0x20;
  gtest_ar_._0_4_ = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  gtest_ar_._4_4_ = extraout_var;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&path,"0U","pImp->StackSize()",(uint *)&gtest_ar__2,
             (unsigned_long *)&gtest_ar_);
  if ((char)path._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (path._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)path._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&path._M_string_length);
  pTVar1 = (this->super_IOSystemTest).pImp;
  pcVar3 = "";
  std::__cxx11::string::string((string *)&path,"",(allocator *)&gtest_ar__2);
  iVar2 = (*(pTVar1->super_IOSystem)._vptr_IOSystem[7])(pTVar1,&path);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,(char)iVar2) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&path);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&path,(internal *)&gtest_ar_,(AssertionResult *)"pImp->PushDirectory( \"\" )","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x44,(char *)CONCAT71(path._M_dataplus._M_p._1_7_,(char)path._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&path);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&path,"test/",(allocator *)&gtest_ar_);
  pTVar1 = (this->super_IOSystemTest).pImp;
  iVar2 = (*(pTVar1->super_IOSystem)._vptr_IOSystem[7])(pTVar1,&path);
  gtest_ar__2.success_ = SUB41(iVar2,0);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (SUB41(iVar2,0) == false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"pImp->PushDirectory( path )","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x46,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  local_78.data_._0_4_ = 1;
  gtest_ar__2._0_4_ = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  gtest_ar__2._4_4_ = extraout_var_00;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"1U","pImp->StackSize()",(uint *)&local_78,
             (unsigned_long *)&gtest_ar__2);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  iVar2 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[8])();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_,"path","pImp->CurrentDirectory()",&path,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_01,iVar2));
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  iVar2 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  gtest_ar__2.success_ = SUB41(iVar2,0);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (SUB41(iVar2,0) == false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"pImp->PopDirectory()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x49,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  local_78.data_._0_4_ = 0;
  gtest_ar__2._0_4_ = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  gtest_ar__2._4_4_ = extraout_var_02;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0U","pImp->StackSize()",(uint *)&local_78,
             (unsigned_long *)&gtest_ar__2);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

TEST_F( IOSystemTest, accessDirectoryStackTest ) {
    EXPECT_FALSE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
    EXPECT_FALSE( pImp->PushDirectory( "" ) );
    std::string path = "test/";
    EXPECT_TRUE( pImp->PushDirectory( path ) );
    EXPECT_EQ( 1U, pImp->StackSize() );
    EXPECT_EQ( path, pImp->CurrentDirectory() );
    EXPECT_TRUE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
}